

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

bool __thiscall
Key_Offset_Store_Data::operator==(Key_Offset_Store_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = id;
  iVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar1 == (Am_ID_Tag)iVar2) {
    if ((Key_Offset_Store_Data *)test_value == this) {
      return true;
    }
    if ((*(short *)&test_value->field_0xc == *(short *)&(this->super_Am_Wrapper).field_0xc) &&
       (*(int *)&test_value[1].super_Am_Registered_Type._vptr_Am_Registered_Type == this->offset)) {
      return (bool)(-(this->multiplier ==
                     *(float *)((long)&test_value[1].super_Am_Registered_Type.
                                       _vptr_Am_Registered_Type + 4)) & 1);
    }
  }
  return false;
}

Assistant:

inline void
modify_value(Am_Value &value, int offset, float multiplier)
{
  switch (value.type) {
  case Am_INT:
  case Am_LONG:
    value.value.long_value =
        (long)(value.value.long_value * multiplier) + offset;
    break;
  case Am_FLOAT:
    value.value.float_value = (value.value.float_value * multiplier) + offset;
    break;
  case Am_DOUBLE: {
    double d_value = value;
    d_value = (d_value * multiplier) + offset;
    value = d_value;
    break;
  }
  default:
    break;
  }
}